

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O2

void __thiscall
google::protobuf::internal::ImplicitWeakMessage::ImplicitWeakMessage
          (ImplicitWeakMessage *this,Arena *arena)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = (intptr_t)arena;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ImplicitWeakMessage_00441510;
  pbVar1 = Arena::Create<std::__cxx11::string>(arena);
  this->data_ = pbVar1;
  (this->cached_size_).atom_ = 0;
  return;
}

Assistant:

explicit ImplicitWeakMessage(Arena* arena)
      : MessageLite(arena, class_data_.base()),
        data_(Arena::Create<std::string>(arena)) {}